

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O3

Bac_Man_t * Psr_ManBuildCba(char *pFileName,Vec_Ptr_t *vDes)

{
  void **ppvVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Bac_Man_t *p;
  char *pcVar9;
  size_t sVar10;
  Abc_Nam_t *pAVar11;
  Bac_Ntk_t *pBVar12;
  Vec_Int_t *vMap;
  int *__s;
  Vec_Int_t *vBoxes;
  int *piVar13;
  void *pvVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  long *plVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  Psr_Ntk_t *local_80;
  int local_54;
  int *local_50;
  Bac_Man_t *local_48;
  ulong local_40;
  long local_38;
  
  iVar8 = vDes->nSize;
  if (iVar8 < 1) {
    local_80 = (Psr_Ntk_t *)0x0;
  }
  else {
    local_80 = (Psr_Ntk_t *)*vDes->pArray;
  }
  p = (Bac_Man_t *)calloc(1,0x530);
  pcVar9 = Extra_FileDesignName(pFileName);
  p->pName = pcVar9;
  if (pFileName == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pFileName);
    pcVar9 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar9,pFileName);
  }
  p->pSpec = pcVar9;
  pAVar11 = Abc_NamStart(1000,0x18);
  p->pStrs = pAVar11;
  pAVar11 = Abc_NamStart(1000,0x18);
  p->pMods = pAVar11;
  p->iRoot = 1;
  p->nNtks = iVar8;
  uVar15 = iVar8 + 1;
  pBVar12 = (Bac_Ntk_t *)calloc((long)(int)uVar15,0xd0);
  p->pNtks = pBVar12;
  auVar4 = _DAT_0093d220;
  auVar3 = _DAT_0093d210;
  if (0 < iVar8) {
    lVar16 = (ulong)uVar15 - 2;
    auVar21._8_4_ = (int)lVar16;
    auVar21._0_8_ = lVar16;
    auVar21._12_4_ = (int)((ulong)lVar16 >> 0x20);
    pBVar12 = pBVar12 + 1;
    uVar17 = 0;
    auVar21 = auVar21 ^ _DAT_0093d220;
    do {
      auVar22._8_4_ = (int)uVar17;
      auVar22._0_8_ = uVar17;
      auVar22._12_4_ = (int)(uVar17 >> 0x20);
      auVar22 = (auVar22 | auVar3) ^ auVar4;
      if ((bool)(~(auVar22._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar22._0_4_ ||
                  auVar21._4_4_ < auVar22._4_4_) & 1)) {
        pBVar12->pDesign = p;
      }
      if ((auVar22._12_4_ != auVar21._12_4_ || auVar22._8_4_ <= auVar21._8_4_) &&
          auVar22._12_4_ <= auVar21._12_4_) {
        pBVar12[1].pDesign = p;
      }
      uVar17 = uVar17 + 2;
      pBVar12 = pBVar12 + 2;
    } while ((uVar15 & 0xfffffffe) != uVar17);
  }
  Bac_ManSetupTypes(p->pPrimNames,p->pPrimSymbs);
  uVar5 = Abc_NamObjNumMax(local_80->pStrs);
  uVar19 = uVar5 + 1;
  vMap = (Vec_Int_t *)malloc(0x10);
  uVar15 = 0x10;
  if (0xe < uVar5) {
    uVar15 = uVar19;
  }
  vMap->nCap = uVar15;
  local_40 = (ulong)uVar5;
  if (uVar15 == 0) {
    vMap->pArray = (int *)0x0;
    vMap->nSize = uVar19;
  }
  else {
    __s = (int *)malloc((long)(int)uVar15 << 2);
    vMap->pArray = __s;
    vMap->nSize = uVar19;
    if (__s != (int *)0x0) {
      memset(__s,0xff,(long)(int)uVar19 << 2);
      goto LAB_003b9632;
    }
  }
  __s = (int *)0x0;
LAB_003b9632:
  iVar8 = (local_80->vObjs).nSize;
  vBoxes = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar8 - 1U) {
    iVar7 = iVar8;
  }
  vBoxes->nSize = 0;
  vBoxes->nCap = iVar7;
  if (iVar7 == 0) {
    piVar13 = (int *)0x0;
  }
  else {
    piVar13 = (int *)malloc((long)iVar7 << 2);
  }
  vBoxes->pArray = piVar13;
  Abc_NamDeref(p->pStrs);
  pAVar11 = Abc_NamRef(local_80->pStrs);
  p->pStrs = pAVar11;
  if (0 < vDes->nSize) {
    lVar16 = 0xd0;
    lVar18 = 0;
    local_50 = __s;
    local_48 = p;
    do {
      if (lVar18 < local_48->nNtks) {
        plVar20 = (long *)((long)&local_48->pNtks->pDesign + lVar16);
      }
      else {
        plVar20 = (long *)0x0;
      }
      local_80 = (Psr_Ntk_t *)vDes->pArray[lVar18];
      iVar8 = local_80->iModuleName;
      iVar7 = (local_80->vInputs).nSize;
      iVar2 = (local_80->vOutputs).nSize;
      local_38 = lVar16;
      iVar6 = Psr_NtkCountObjects(local_80);
      if (*plVar20 == 0) {
        __assert_fail("pNew->pDesign != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                      ,0x218,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
      }
      if (*(int *)((long)plVar20 + 0x24) != 0) {
        __assert_fail("Bac_NtkPiNum(pNew) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                      ,0x219,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
      }
      if (*(int *)((long)plVar20 + 0x34) != 0) {
        __assert_fail("Bac_NtkPoNum(pNew) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                      ,0x21a,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
      }
      *(int *)(plVar20 + 1) = iVar8;
      *(undefined8 *)((long)plVar20 + 0xc) = 0xffffffffffffffff;
      *(undefined4 *)((long)plVar20 + 0x14) = 0xffffffff;
      if ((int)plVar20[4] < iVar7) {
        if ((void *)plVar20[5] == (void *)0x0) {
          pvVar14 = malloc((long)iVar7 << 2);
        }
        else {
          pvVar14 = realloc((void *)plVar20[5],(long)iVar7 << 2);
        }
        plVar20[5] = (long)pvVar14;
        if (pvVar14 == (void *)0x0) goto LAB_003b9c33;
        *(int *)(plVar20 + 4) = iVar7;
      }
      if ((int)plVar20[6] < iVar2) {
        if ((void *)plVar20[7] == (void *)0x0) {
          pvVar14 = malloc((long)iVar2 << 2);
        }
        else {
          pvVar14 = realloc((void *)plVar20[7],(long)iVar2 << 2);
        }
        plVar20[7] = (long)pvVar14;
        if (pvVar14 == (void *)0x0) goto LAB_003b9c33;
        *(int *)(plVar20 + 6) = iVar2;
      }
      if ((int)plVar20[10] < iVar6) {
        if ((void *)plVar20[0xb] == (void *)0x0) {
          pvVar14 = malloc((long)iVar6);
        }
        else {
          pvVar14 = realloc((void *)plVar20[0xb],(long)iVar6);
        }
        plVar20[0xb] = (long)pvVar14;
        *(int *)(plVar20 + 10) = iVar6;
      }
      if ((int)plVar20[0xc] < iVar6) {
        if ((void *)plVar20[0xd] == (void *)0x0) {
          pvVar14 = malloc((long)iVar6 << 2);
        }
        else {
          pvVar14 = realloc((void *)plVar20[0xd],(long)iVar6 << 2);
        }
        plVar20[0xd] = (long)pvVar14;
        if (pvVar14 == (void *)0x0) {
LAB_003b9c33:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        *(int *)(plVar20 + 0xc) = iVar6;
      }
      pAVar11 = *(Abc_Nam_t **)(*plVar20 + 0x18);
      pcVar9 = Abc_NamStr(*(Abc_Nam_t **)(*plVar20 + 0x10),iVar8);
      iVar7 = Abc_NamStrFindOrAdd(pAVar11,pcVar9,&local_54);
      lVar16 = *plVar20;
      if (local_54 == 0) {
        iVar8 = (int)((ulong)((long)plVar20 - *(long *)(lVar16 + 0x28)) >> 4) * -0x3b13b13b;
        if ((iVar8 < 1) || (*(int *)(lVar16 + 0x24) < iVar8)) {
          __assert_fail("Bac_ManNtkIsOk(p->pDesign, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                        ,0xd2,"int Bac_NtkId(Bac_Ntk_t *)");
        }
        if (iVar7 != iVar8) {
          __assert_fail("NtkId == Bac_NtkId(pNew)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                        ,0x228,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
        }
      }
      else {
        pcVar9 = Abc_NamStr(*(Abc_Nam_t **)(lVar16 + 0x10),iVar8);
        printf("Network with name %s already exists.\n",pcVar9);
      }
      lVar18 = lVar18 + 1;
      lVar16 = local_38 + 0xd0;
      p = local_48;
      __s = local_50;
    } while (lVar18 < vDes->nSize);
  }
  if ((((local_80->field_0x4 & 1) == 0) &&
      (((local_80->field_0x4 & 2) == 0 || (iVar8 = Psr_ManIsMapped(local_80), iVar8 == 0)))) ||
     (iVar8 = Bac_NtkBuildLibrary(p), iVar8 != 0)) {
    if (0 < vDes->nSize) {
      lVar16 = 0xd0;
      lVar18 = 0;
      do {
        if (lVar18 < p->nNtks) {
          pBVar12 = (Bac_Ntk_t *)((long)&p->pNtks->pDesign + lVar16);
        }
        else {
          pBVar12 = (Bac_Ntk_t *)0x0;
        }
        ppvVar1 = vDes->pArray + lVar18;
        lVar18 = lVar18 + 1;
        Psr_ManBuildNtk(pBVar12,vDes,(Psr_Ntk_t *)*ppvVar1,vMap,vBoxes);
        lVar16 = lVar16 + 0xd0;
      } while (lVar18 < vDes->nSize);
    }
  }
  else {
    if (0 < p->nNtks) {
      lVar16 = 0x198;
      lVar18 = 0;
      do {
        pBVar12 = p->pNtks;
        pvVar14 = *(void **)((long)pBVar12 + lVar16 + -0xa0);
        if (pvVar14 != (void *)0x0) {
          free(pvVar14);
          *(undefined8 *)((long)pBVar12 + lVar16 + -0xa0) = 0;
        }
        *(undefined8 *)((long)pBVar12 + lVar16 + -0xa8) = 0;
        pvVar14 = *(void **)((long)pBVar12 + lVar16 + -0x90);
        if (pvVar14 != (void *)0x0) {
          free(pvVar14);
          *(undefined8 *)((long)pBVar12 + lVar16 + -0x90) = 0;
        }
        *(undefined8 *)((long)pBVar12 + lVar16 + -0x98) = 0;
        pvVar14 = *(void **)((long)pBVar12 + lVar16 + -0x80);
        if (pvVar14 != (void *)0x0) {
          free(pvVar14);
          *(undefined8 *)((long)pBVar12 + lVar16 + -0x80) = 0;
        }
        *(undefined8 *)((long)pBVar12 + lVar16 + -0x88) = 0;
        pvVar14 = *(void **)((long)pBVar12 + lVar16 + -0x70);
        if (pvVar14 != (void *)0x0) {
          free(pvVar14);
          *(undefined8 *)((long)pBVar12 + lVar16 + -0x70) = 0;
        }
        *(undefined8 *)((long)pBVar12 + lVar16 + -0x78) = 0;
        pvVar14 = *(void **)((long)pBVar12 + lVar16 + -0x60);
        if (pvVar14 != (void *)0x0) {
          free(pvVar14);
          *(undefined8 *)((long)pBVar12 + lVar16 + -0x60) = 0;
        }
        *(undefined8 *)((long)pBVar12 + lVar16 + -0x68) = 0;
        pvVar14 = *(void **)((long)pBVar12 + lVar16 + -0x50);
        if (pvVar14 != (void *)0x0) {
          free(pvVar14);
          *(undefined8 *)((long)pBVar12 + lVar16 + -0x50) = 0;
        }
        *(undefined8 *)((long)pBVar12 + lVar16 + -0x58) = 0;
        pvVar14 = *(void **)((long)pBVar12 + lVar16 + -0x40);
        if (pvVar14 != (void *)0x0) {
          free(pvVar14);
          *(undefined8 *)((long)pBVar12 + lVar16 + -0x40) = 0;
        }
        *(undefined8 *)((long)pBVar12 + lVar16 + -0x48) = 0;
        pvVar14 = *(void **)((long)pBVar12 + lVar16 + -0x30);
        if (pvVar14 != (void *)0x0) {
          free(pvVar14);
          *(undefined8 *)((long)pBVar12 + lVar16 + -0x30) = 0;
        }
        *(undefined8 *)((long)pBVar12 + lVar16 + -0x38) = 0;
        pvVar14 = *(void **)((long)pBVar12 + lVar16 + -0x20);
        if (pvVar14 != (void *)0x0) {
          free(pvVar14);
          *(undefined8 *)((long)pBVar12 + lVar16 + -0x20) = 0;
        }
        *(undefined8 *)((long)pBVar12 + lVar16 + -0x28) = 0;
        pvVar14 = *(void **)((long)pBVar12 + lVar16 + -0x10);
        if (pvVar14 != (void *)0x0) {
          free(pvVar14);
          *(undefined8 *)((long)pBVar12 + lVar16 + -0x10) = 0;
        }
        *(undefined8 *)((long)pBVar12 + lVar16 + -0x18) = 0;
        pvVar14 = *(void **)((long)&pBVar12->pDesign + lVar16);
        if (pvVar14 != (void *)0x0) {
          free(pvVar14);
          *(undefined8 *)((long)&pBVar12->pDesign + lVar16) = 0;
        }
        *(undefined8 *)((long)pBVar12 + lVar16 + -8) = 0;
        lVar18 = lVar18 + 1;
        lVar16 = lVar16 + 0xd0;
      } while (lVar18 < p->nNtks);
    }
    piVar13 = (p->vBuf2LeafNtk).pArray;
    if (piVar13 != (int *)0x0) {
      free(piVar13);
      (p->vBuf2LeafNtk).pArray = (int *)0x0;
    }
    (p->vBuf2LeafNtk).nCap = 0;
    (p->vBuf2LeafNtk).nSize = 0;
    piVar13 = (p->vBuf2LeafObj).pArray;
    if (piVar13 != (int *)0x0) {
      free(piVar13);
      (p->vBuf2LeafObj).pArray = (int *)0x0;
    }
    (p->vBuf2LeafObj).nCap = 0;
    (p->vBuf2LeafObj).nSize = 0;
    piVar13 = (p->vBuf2RootNtk).pArray;
    if (piVar13 != (int *)0x0) {
      free(piVar13);
      (p->vBuf2RootNtk).pArray = (int *)0x0;
    }
    (p->vBuf2RootNtk).nCap = 0;
    (p->vBuf2RootNtk).nSize = 0;
    piVar13 = (p->vBuf2RootObj).pArray;
    if (piVar13 != (int *)0x0) {
      free(piVar13);
      (p->vBuf2RootObj).pArray = (int *)0x0;
    }
    (p->vBuf2RootObj).nCap = 0;
    (p->vBuf2RootObj).nSize = 0;
    Abc_NamDeref(p->pStrs);
    Abc_NamDeref(p->pMods);
    if (p->pName != (char *)0x0) {
      free(p->pName);
      p->pName = (char *)0x0;
    }
    if (p->pSpec != (char *)0x0) {
      free(p->pSpec);
      p->pSpec = (char *)0x0;
    }
    if (p->pNtks != (Bac_Ntk_t *)0x0) {
      free(p->pNtks);
    }
    free(p);
    p = (Bac_Man_t *)0x0;
  }
  if ((int)local_40 < 0) {
    uVar15 = 0;
  }
  else {
    uVar17 = 0;
    uVar15 = 0;
    do {
      uVar15 = uVar15 + (__s[uVar17] == -1);
      uVar17 = uVar17 + 1;
    } while (uVar19 != uVar17);
  }
  if (uVar15 != uVar19) {
    __assert_fail("Vec_IntCountEntry(vMap, -1) == Vec_IntSize(vMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPrsBuild.c"
                  ,0x157,"Bac_Man_t *Psr_ManBuildCba(char *, Vec_Ptr_t *)");
  }
  if (__s != (int *)0x0) {
    free(__s);
  }
  free(vMap);
  if (vBoxes->pArray != (int *)0x0) {
    free(vBoxes->pArray);
  }
  free(vBoxes);
  return p;
}

Assistant:

Bac_Man_t * Psr_ManBuildCba( char * pFileName, Vec_Ptr_t * vDes )
{
    Psr_Ntk_t * pNtk = Psr_ManRoot( vDes );  int i;
    Bac_Man_t * pNew = Bac_ManAlloc( pFileName, Vec_PtrSize(vDes) );
    Vec_Int_t * vMap = Vec_IntStartFull( Abc_NamObjNumMax(pNtk->pStrs) + 1 );
    Vec_Int_t * vTmp = Vec_IntAlloc( Psr_NtkBoxNum(pNtk) );
    Abc_NamDeref( pNew->pStrs );
    pNew->pStrs = Abc_NamRef( pNtk->pStrs );  
    Vec_PtrForEachEntry( Psr_Ntk_t *, vDes, pNtk, i )
        Bac_NtkAlloc( Bac_ManNtk(pNew, i+1), Psr_NtkId(pNtk), Psr_NtkPiNum(pNtk), Psr_NtkPoNum(pNtk), Psr_NtkCountObjects(pNtk) );
    if ( (pNtk->fMapped || (pNtk->fSlices && Psr_ManIsMapped(pNtk))) && !Bac_NtkBuildLibrary(pNew) )
        Bac_ManFree(pNew), pNew = NULL;
    else 
        Vec_PtrForEachEntry( Psr_Ntk_t *, vDes, pNtk, i )
            Psr_ManBuildNtk( Bac_ManNtk(pNew, i+1), vDes, pNtk, vMap, vTmp );
    assert( Vec_IntCountEntry(vMap, -1) == Vec_IntSize(vMap) );
    Vec_IntFree( vMap );
    Vec_IntFree( vTmp );
//    Vec_StrPrint( &Bac_ManNtk(pNew, 1)->vType, 1 );
    return pNew;
}